

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int complex_test(void)

{
  int iVar1;
  undefined4 uVar2;
  undefined8 *puVar3;
  void *__s1;
  void *__s2;
  FILE *__stream;
  uint local_268;
  int local_264;
  int i_1;
  int j_1;
  int i;
  int j;
  FILE *file;
  int c;
  uint32_t *getted_nodes;
  uint32_t *added_nodes;
  uint8_t string [512];
  trie_s *trie;
  clock_t cStack_20;
  uint32_t node_id;
  time_t end;
  time_t begin;
  int res;
  
  end = 0;
  cStack_20 = 0;
  puVar3 = (undefined8 *)yatrie_new(5000000,5000000,200);
  printf(
        "COMPLEX TEST\nThis test will create trie from a dictionary file, \nthen compare each word leaf node id with returned \nnode id by the yatrie_get_id() function \n\n"
        );
  printf("Trie settings:\nnode size:       %u bytes\n",0x10);
  printf("trie size:       %u kb\n",0);
  printf("trie size nodes: %u kb\n",0);
  printf("trie size refs:  %u kb\n\n");
  memset(&added_nodes,0,0x200);
  __s1 = calloc(6000000,4);
  __s2 = calloc(6000000,4);
  __stream = fopen((char *)dic_path,"r");
  if (__stream != (FILE *)0x0) {
    end = clock();
    j_1 = 0;
    i_1 = 0;
    while (iVar1 = getc(__stream), iVar1 != -1) {
      if ((iVar1 == 10) || (iVar1 == 0xd)) {
        i_1 = i_1 + 1;
        uVar2 = yatrie_add(&added_nodes,0,puVar3);
        *(undefined4 *)((long)__s1 + (long)i_1 * 4) = uVar2;
        memset(&added_nodes,0,0x200);
        j_1 = -1;
        if ((i_1 & 0x3ffffU) == 0) {
          printf("a:%d\n");
        }
      }
      else {
        string[(long)j_1 + -8] = (uint8_t)iVar1;
      }
      j_1 = j_1 + 1;
    }
    cStack_20 = clock();
    rewind(__stream);
    local_264 = 0;
    local_268 = 0;
    while (iVar1 = getc(__stream), iVar1 != -1) {
      if ((iVar1 == 10) || (iVar1 == 0xd)) {
        local_268 = local_268 + 1;
        uVar2 = yatrie_get_id(&added_nodes,0,puVar3);
        *(undefined4 *)((long)__s2 + (long)(int)local_268 * 4) = uVar2;
        memset(&added_nodes,0,0x200);
        local_264 = -1;
        if ((local_268 & 0x3ffff) == 0) {
          printf("g:%d\n");
        }
      }
      else {
        string[(long)local_264 + -8] = (uint8_t)iVar1;
      }
      local_264 = local_264 + 1;
    }
    fclose(__stream);
  }
  iVar1 = memcmp(__s1,__s2,24000000);
  if (iVar1 != 0) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x3a4,"memcmp(added_nodes, getted_nodes, MAX_NODES * 4) == 0");
  }
  begin._4_4_ = (uint)(iVar1 != 0);
  printf("trie creation time: %fs\n",(double)((float)(cStack_20 - end) / 1e+06));
  printf("nodes created: %d\nreferences created: %d\n",(ulong)*(uint *)*puVar3,
         (ulong)*(uint *)puVar3[1]);
  free(__s1);
  free(__s2);
  yatrie_free(puVar3);
  return begin._4_4_;
}

Assistant:

static int complex_test() {
    int res = 0;
    time_t begin = 0;
    time_t end = 0;

    uint32_t node_id = 0;
    trie_s *trie = yatrie_new(5000000, 5000000, 200);


    printf("COMPLEX TEST\n"
           "This test will create trie from a dictionary file, \n"
           "then compare each word leaf node id with returned \n"
           "node id by the yatrie_get_id() function \n\n");
    printf("Trie settings:\n"
           "node size:       %u bytes\n", sizeof(node_s));
    printf("trie size:       %u kb\n", sizeof(trie_s) / 1024);
    printf("trie size nodes: %u kb\n", sizeof(trie->nodes) / 1024);
    printf("trie size refs:  %u kb\n\n", sizeof(trie->refs) / 1024);

    uint8_t string[512] = {};
#define MAX_NODES 6000000
    uint32_t *added_nodes = (uint32_t *) calloc(MAX_NODES, 4);
    uint32_t *getted_nodes = (uint32_t *) calloc(MAX_NODES, 4);


    int c = 0;
    FILE *file;
    file = fopen(dic_path, "r");
    if (file) {
        begin = clock();
        for (int j = 0, i = 0; (c = getc(file)) != EOF; ++j) {
            if (c == '\n' || c == '\r') {
                ++i;

                added_nodes[i] = yatrie_add(string, 0, trie);

                memset(string, 0, 512);
                j = -1;
                (i & 262143) == 0 ? printf("a:%d\n", i) : 0;
                continue;
            }
            string[j] = c;
        }
        end = clock();

        rewind(file);

        for (int j = 0, i = 0; (c = getc(file)) != EOF; ++j) {
            if (c == '\n' || c == '\r') {
                ++i;
                getted_nodes[i] = yatrie_get_id(string, 0, trie);

                memset(string, 0, 512);
                j = -1;
                (i & 262143) == 0 ? printf("g:%d\n", i) : 0;
                continue;
            }
            string[j] = c;
        }

        fclose(file);
    }


    //check added nodes array and getted nodes array
    U_ASSERT(res, memcmp(added_nodes, getted_nodes, MAX_NODES * 4) == 0);

    printf("trie creation time: %fs\n", (end - begin) / (float) 1000000);
    printf("nodes created: %d\nreferences created: %d\n", trie->nodes->increment, trie->refs->increment);


    free(added_nodes);
    free(getted_nodes);

    yatrie_free(trie);
    return res;
}